

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

QString * __thiscall
QAccessibleLineEdit::text
          (QString *__return_storage_ptr__,QAccessibleLineEdit *this,int startOffset,int endOffset)

{
  EchoMode EVar1;
  QLineEdit *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (startOffset <= endOffset) {
    pQVar2 = lineEdit(this);
    EVar1 = QLineEdit::echoMode(pQVar2);
    if (EVar1 == Normal) {
      pQVar2 = lineEdit(this);
      QLineEdit::text((QString *)&local_40,pQVar2);
      QString::mid((longlong)__return_storage_ptr__,(longlong)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return __return_storage_ptr__;
      }
      goto LAB_004d86ad;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_004d86ad:
  __stack_chk_fail();
}

Assistant:

QString QAccessibleLineEdit::text(int startOffset, int endOffset) const
{
    if (startOffset > endOffset)
        return QString();

    if (lineEdit()->echoMode() != QLineEdit::Normal)
        return QString();

    return lineEdit()->text().mid(startOffset, endOffset - startOffset);
}